

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O3

PixelBufferAccess * __thiscall
rr::MultisamplePixelBufferAccess::toSinglesampleAccess
          (PixelBufferAccess *__return_storage_ptr__,MultisamplePixelBufferAccess *this)

{
  IVec3 local_20;
  IVec3 local_14;
  
  local_14.m_data[0] = (this->m_access).super_ConstPixelBufferAccess.m_size.m_data[1];
  local_14.m_data[1] = (this->m_access).super_ConstPixelBufferAccess.m_size.m_data[2];
  local_14.m_data[2] = 1;
  local_20.m_data[0] = (this->m_access).super_ConstPixelBufferAccess.m_pitch.m_data[1];
  local_20.m_data[1] = (this->m_access).super_ConstPixelBufferAccess.m_pitch.m_data[2];
  local_20.m_data[2] = local_14.m_data[1] * local_20.m_data[1];
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,(TextureFormat *)this,&local_14,&local_20,
             (this->m_access).super_ConstPixelBufferAccess.m_data);
  return __return_storage_ptr__;
}

Assistant:

const tcu::PixelBufferAccess MultisamplePixelBufferAccess::toSinglesampleAccess (void) const
{
	DE_ASSERT(getNumSamples() == 1);

	return tcu::PixelBufferAccess(m_access.getFormat(),
								  tcu::IVec3(m_access.getHeight(), m_access.getDepth(), 1),
								  tcu::IVec3(m_access.getRowPitch(), m_access.getSlicePitch(), m_access.getSlicePitch() * m_access.getDepth()),
								  m_access.getDataPtr());
}